

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatzinc.cpp
# Opt level: O0

void __thiscall FlatZinc::FlatZincSpace::newIntVar(FlatZincSpace *this,IntVarSpec *vs,string *name)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  IntVar **ppIVar7;
  SetLit **ppSVar8;
  int *piVar9;
  long in_RSI;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<IntVar_*,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var10;
  int in_stack_0000002c;
  int *i;
  iterator __end5;
  iterator __begin5;
  vector<int,_std::allocator<int>_> *__range5;
  vec<int> d;
  vec<int> *in_stack_00000190;
  IntVar *in_stack_00000198;
  IntVarSL *in_stack_000001a0;
  SetLit *sl;
  IntVar *v;
  bool considerIntroduced;
  int newSize;
  undefined4 in_stack_fffffffffffffe28;
  uint in_stack_fffffffffffffe2c;
  byte bVar11;
  pair<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe30;
  IntVar *pIVar12;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  vec<int> *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffec0;
  undefined1 __x;
  size_type in_stack_fffffffffffffec8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffed0;
  int local_10c;
  reference local_f8;
  anon_union_8_2_743a5d44_for_Reason_0 local_e8;
  _Base_ptr local_e0;
  undefined1 local_d8;
  reference local_a8;
  int *local_a0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  vector<int,_std::allocator<int>_> *local_90;
  vec<int> local_88;
  _Base_ptr local_78;
  undefined1 local_70;
  SetLit *local_30;
  IntVar *local_28;
  byte local_1d;
  int local_1c;
  long local_10;
  
  __x = (undefined1)((ulong)in_stack_fffffffffffffec0 >> 0x38);
  uVar4 = *(uint *)(in_RDI + 8);
  local_10 = in_RSI;
  uVar3 = vec<IntVar_*>::size((vec<IntVar_*> *)(in_RDI + 0x10));
  if (uVar4 == uVar3) {
    if (*(int *)(in_RDI + 8) < 1) {
      local_10c = 1;
    }
    else {
      local_10c = *(int *)(in_RDI + 8) << 1;
    }
    local_1c = local_10c;
    vec<IntVar_*>::growTo((vec<IntVar_*> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    std::vector<bool,_std::allocator<bool>_>::resize
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(bool)__x);
  }
  if ((so.use_var_is_introduced & 1U) == 0) {
    local_1d = *(byte *)(local_10 + 8) ^ 0xff;
  }
  else {
    local_1d = *(byte *)(local_10 + 9);
  }
  local_1d = local_1d & 1;
  if (((so.introduced_heuristic & 1U) != 0) && ((*(byte *)(local_10 + 10) & 1) != 0)) {
    local_1d = 1;
  }
  if ((*(byte *)(local_10 + 0x10) & 1) != 0) {
    ppIVar7 = vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 0x10),*(uint *)(local_10 + 0xc));
    pIVar12 = *ppIVar7;
    uVar4 = *(uint *)(in_RDI + 8);
    *(uint *)(in_RDI + 8) = uVar4 + 1;
    ppIVar7 = vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 0x10),uVar4);
    *ppIVar7 = pIVar12;
    goto LAB_0011e6db;
  }
  local_28 = (IntVar *)0x0;
  if ((*(byte *)(local_10 + 0x11) & 1) == 0) {
    bVar2 = Option<FlatZinc::AST::SetLit_*>::operator()
                      ((Option<FlatZinc::AST::SetLit_*> *)(local_10 + 0x18));
    if (bVar2) {
      ppSVar8 = Option<FlatZinc::AST::SetLit_*>::some
                          ((Option<FlatZinc::AST::SetLit_*> *)(local_10 + 0x18));
      local_30 = *ppSVar8;
      if ((local_30->interval & 1U) == 0) {
        vec<int>::vec(&local_88);
        local_90 = &local_30->s;
        local_98._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        local_a0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                    ((vector<int,_std::allocator<int>_> *)
                                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffe30,
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)),
              bVar2) {
          local_a8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_98);
          vec<int>::push(in_stack_fffffffffffffe40,
                         (int *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_98);
        }
        ::vec::operator_cast_to_int_((vec *)&local_88);
        ::vec::operator_cast_to_int_((vec *)&local_88);
        vec<int>::size(&local_88);
        std::sort<int*>((int *)in_stack_fffffffffffffe40,
                        (int *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
        vec<int>::operator[](&local_88,0);
        vec<int>::last(&local_88);
        local_28 = ::newIntVar((int)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                               (int)in_stack_fffffffffffffe40);
        std::
        pair<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<IntVar_*&,_true>
                  (in_stack_fffffffffffffe30,
                   (IntVar **)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11e40d);
        _Var10 = std::
                 map<IntVar*,std::__cxx11::string,std::less<IntVar*>,std::allocator<std::pair<IntVar*const,std::__cxx11::string>>>
                 ::insert<std::pair<IntVar*,std::__cxx11::string>>
                           ((map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffe40,
                            (pair<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
        local_e0 = (_Base_ptr)_Var10.first._M_node;
        local_d8 = _Var10.second;
        std::
        pair<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x11e453);
        piVar9 = vec<int>::last(&local_88);
        iVar6 = *piVar9;
        piVar9 = vec<int>::operator[](&local_88,0);
        iVar1 = *piVar9;
        uVar4 = vec<int>::size(&local_88);
        uVar3 = vec<int>::size(&local_88);
        iVar5 = mylog2(uVar3);
        if (iVar6 - iVar1 < (int)(uVar4 * iVar5)) {
          uVar4 = vec<int>::size(&local_88);
          if ((int)uVar4 <= so.eager_limit) {
            piVar9 = vec<int>::last(&local_88);
            in_stack_fffffffffffffe4c = *piVar9;
            in_stack_fffffffffffffe50 =
                 (vector<bool,_std::allocator<bool>_> *)vec<int>::operator[](&local_88,0);
            if (so.eager_limit <
                (in_stack_fffffffffffffe4c -
                *(int *)&(in_stack_fffffffffffffe50->super__Bvector_base<std::allocator<bool>_>).
                         _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) +
                1) goto LAB_0011e55d;
          }
          pIVar12 = local_28;
          Reason::Reason((Reason *)&local_e8,(Clause *)0x0);
          iVar6 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0x12])
                            (pIVar12,&local_88,local_e8._pt,1);
          if ((((byte)iVar6 ^ 0xff) & 1) != 0) {
            printf("=====UNSATISFIABLE=====\n");
            printf("%% Top level failure!\n");
            exit(0);
          }
        }
        else {
LAB_0011e55d:
          IntVarSL::IntVarSL(in_stack_000001a0,in_stack_00000198,in_stack_00000190);
        }
        vec<int>::~vec((vec<int> *)in_stack_fffffffffffffe30);
      }
      else {
        local_28 = ::newIntVar((int)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                               (int)in_stack_fffffffffffffe40);
        std::
        pair<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<IntVar_*&,_true>
                  (in_stack_fffffffffffffe30,
                   (IntVar **)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11e1ec);
        _Var10 = std::
                 map<IntVar*,std::__cxx11::string,std::less<IntVar*>,std::allocator<std::pair<IntVar*const,std::__cxx11::string>>>
                 ::insert<std::pair<IntVar*,std::__cxx11::string>>
                           ((map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffe40,
                            (pair<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
        local_78 = (_Base_ptr)_Var10.first._M_node;
        local_70 = _Var10.second;
        std::
        pair<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x11e23c);
      }
    }
    else {
      local_28 = ::newIntVar((int)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                             (int)in_stack_fffffffffffffe40);
    }
  }
  else {
    local_28 = getConstant(in_stack_0000002c);
  }
  if (((so.exclude_introduced & 1U) != 0) && ((local_1d & 1) != 0)) {
    local_28->should_be_learnable = false;
  }
  if (((so.decide_introduced & 1U) == 0) && ((local_1d & 1) != 0)) {
    local_28->should_be_decidable = false;
  }
  uVar4 = *(uint *)(in_RDI + 8);
  *(uint *)(in_RDI + 8) = uVar4 + 1;
  pIVar12 = local_28;
  ppIVar7 = vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 0x10),uVar4);
  *ppIVar7 = pIVar12;
LAB_0011e6db:
  bVar11 = local_1d;
  local_f8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_fffffffffffffe50,
                        CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  std::_Bit_reference::operator=(&local_f8,(bool)(bVar11 & 1));
  return;
}

Assistant:

void FlatZincSpace::newIntVar(IntVarSpec* vs, const std::string& name) {
	// Resizing of the vectors if required
	if (intVarCount == static_cast<int>(iv.size())) {
		const int newSize = intVarCount > 0 ? 2 * intVarCount : 1;
		iv.growTo(newSize);
		iv_introduced.resize(newSize);
	}
	bool considerIntroduced = false;
	if (so.use_var_is_introduced) {
		considerIntroduced = vs->introduced;
	} else {
		considerIntroduced = !vs->output;
	}
	if (so.introduced_heuristic && vs->looks_introduced) {
		considerIntroduced = true;
	}
	if (vs->alias) {
		iv[intVarCount++] = iv[vs->i];
	} else {
		IntVar* v = nullptr;
		if (vs->assigned) {
			v = getConstant(vs->i);
		} else if (vs->domain()) {
			AST::SetLit* sl = vs->domain.some();
			if (sl->interval) {
				v = ::newIntVar(sl->min, sl->max);
				intVarString.insert(std::pair<IntVar*, std::string>(v, name));
			} else {
				vec<int> d;
				for (const int& i : sl->s) {
					d.push(i);
				}
				std::sort((int*)d, (int*)d + d.size());
				v = ::newIntVar(d[0], d.last());
				intVarString.insert(std::pair<IntVar*, std::string>(v, name));
				if ((d.last() - d[0] >= static_cast<int>(d.size() * mylog2(d.size()))) ||
						(static_cast<int>(d.size()) <= so.eager_limit &&
						 (d.last() - d[0] + 1) > so.eager_limit)) {
					new (v) IntVarSL(*v, d);
				} else {
					if (!v->allowSet(d)) {
						TL_FAIL();
					}
				}
			}
		} else {
			v = ::newIntVar();
		}
		/* std::cerr << "int var: " << intVarCount << " " << v << "\n"; */

		if (so.exclude_introduced && considerIntroduced) {
			v->should_be_learnable = false;
		}
		if (!so.decide_introduced && considerIntroduced) {
			v->should_be_decidable = false;
		}
		iv[intVarCount++] = v;
	}
	iv_introduced[intVarCount - 1] = considerIntroduced;
}